

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O1

int __thiscall ieee754::is_mantissa_zero(ieee754 *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = this->ebits;
  if ((int)uVar2 < 8) {
    uVar3 = this->bytes - 1;
  }
  else {
    uVar3 = 0;
    if ((int)uVar2 < 0x10) {
      uVar3 = this->bytes - 2;
    }
  }
  if ((int)uVar2 < 8) {
    uVar5 = 0x7f;
  }
  else {
    if (0xf < (int)uVar2) {
      uVar5 = 0;
      goto LAB_0026e47c;
    }
    uVar2 = (uint)(byte)((char)uVar2 - 7);
    uVar5 = 0xff;
  }
  uVar5 = uVar5 >> ((byte)uVar2 & 0x1f);
LAB_0026e47c:
  uVar2 = uVar5 & 0xff & (uint)this->buf[(int)uVar3];
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pbVar1 = this->buf + uVar4;
      uVar4 = uVar4 + 1;
      uVar2 = uVar2 + *pbVar1;
    } while (uVar3 != uVar4);
  }
  return (int)(uVar2 == 0);
}

Assistant:

int mantissa_msb_index() const
    {
        if (ebits <= 7)
            return bytes - 1;
        else if (ebits <= 15)
            return bytes - 2;
        else
        {
            assert(FALSE);
            return 0;
        }
    }